

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatementBlock.h
# Opt level: O2

void __thiscall StatementBlock::execute(StatementBlock *this,Environment *env)

{
  pointer psVar1;
  element_type *peVar2;
  ptr<Statement> *statement;
  pointer psVar3;
  
  psVar1 = (this->statements).
           super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->statements).
                super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (**peVar2->_vptr_Statement)(peVar2,env);
  }
  return;
}

Assistant:

void execute(Environment* env) override {
        for(ptr<Statement>& statement : statements) {
            statement -> execute(env);
        }
    }